

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::TracingMuxerImpl::SetBatchCommitsDurationForTesting
          (TracingMuxerImpl *this,uint32_t batch_commits_duration_ms,BackendType backend_type)

{
  bool bVar1;
  int iVar2;
  reference pRVar3;
  pointer pPVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  RegisteredBackend *backend;
  iterator __end2;
  iterator __begin2;
  vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
  *__range2;
  BackendType backend_type_local;
  uint32_t batch_commits_duration_ms_local;
  TracingMuxerImpl *this_local;
  
  __end2 = std::
           vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
           ::begin(&this->backends_);
  backend = (RegisteredBackend *)
            std::
            vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
            ::end(&this->backends_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend_*,_std::vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>_>
                                     *)&backend), bVar1) {
    pRVar3 = __gnu_cxx::
             __normal_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend_*,_std::vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>_>
             ::operator*(&__end2);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pRVar3->producer);
    if (((bVar1) &&
        (pPVar4 = std::
                  unique_ptr<perfetto::internal::TracingMuxerImpl::ProducerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ProducerImpl>_>
                  ::operator->(&pRVar3->producer), (pPVar4->connected_ & 1U) != 0)) &&
       (pRVar3->type == backend_type)) {
      pPVar4 = std::
               unique_ptr<perfetto::internal::TracingMuxerImpl::ProducerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ProducerImpl>_>
               ::operator->(&pRVar3->producer);
      peVar5 = std::
               __shared_ptr_access<perfetto::ProducerEndpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<perfetto::ProducerEndpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pPVar4->service_);
      iVar2 = (*peVar5->_vptr_ProducerEndpoint[0xb])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x40))
                ((long *)CONCAT44(extraout_var,iVar2),batch_commits_duration_ms);
    }
    __gnu_cxx::
    __normal_iterator<perfetto::internal::TracingMuxerImpl::RegisteredBackend_*,_std::vector<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void TracingMuxerImpl::SetBatchCommitsDurationForTesting(
    uint32_t batch_commits_duration_ms,
    BackendType backend_type) {
  for (RegisteredBackend& backend : backends_) {
    if (backend.producer && backend.producer->connected_ &&
        backend.type == backend_type) {
      backend.producer->service_->MaybeSharedMemoryArbiter()
          ->SetBatchCommitsDuration(batch_commits_duration_ms);
    }
  }
}